

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int copy_out(archive_write *a,uint64_t offset,uint64_t length)

{
  __off_t _Var1;
  int *piVar2;
  ssize_t sVar3;
  uchar *wb;
  ssize_t rs;
  size_t rsize;
  int r;
  xar_conflict *xar;
  uint64_t length_local;
  uint64_t offset_local;
  archive_write *a_local;
  
  piVar2 = (int *)a->format_data;
  _Var1 = lseek(*piVar2,offset,0);
  xar = (xar_conflict *)length;
  if (_Var1 < 0) {
    piVar2 = __errno_location();
    archive_set_error(&a->archive,*piVar2,"lseek failed");
    a_local._4_4_ = -0x1e;
  }
  else {
    do {
      if (xar == (xar_conflict *)0x0) {
        return 0;
      }
      if (*(xar_conflict **)(piVar2 + 0x4048) < xar) {
        rs = *(ssize_t *)(piVar2 + 0x4048);
      }
      else {
        rs = (ssize_t)xar;
      }
      sVar3 = read(*piVar2,(void *)((long)piVar2 + (0x10120 - *(long *)(piVar2 + 0x4048))),rs);
      if (sVar3 < 0) {
        piVar2 = __errno_location();
        archive_set_error(&a->archive,*piVar2,"Can\'t read temporary file(%jd)",sVar3);
        return -0x1e;
      }
      if (sVar3 == 0) {
        archive_set_error(&a->archive,0,"Truncated xar archive");
        return -0x1e;
      }
      *(long *)(piVar2 + 0x4048) = *(long *)(piVar2 + 0x4048) - sVar3;
      xar = (xar_conflict *)((long)xar - sVar3);
    } while ((*(long *)(piVar2 + 0x4048) != 0) ||
            (a_local._4_4_ = flush_wbuff(a), a_local._4_4_ == 0));
  }
  return a_local._4_4_;
}

Assistant:

static int
copy_out(struct archive_write *a, uint64_t offset, uint64_t length)
{
	struct xar *xar;
	int r;

	xar = (struct xar *)a->format_data;
	if (lseek(xar->temp_fd, offset, SEEK_SET) < 0) {
		archive_set_error(&(a->archive), errno, "lseek failed");
		return (ARCHIVE_FATAL);
	}
	while (length) {
		size_t rsize;
		ssize_t rs;
		unsigned char *wb;

		if (length > xar->wbuff_remaining)
			rsize = xar->wbuff_remaining;
		else
			rsize = (size_t)length;
		wb = xar->wbuff + (sizeof(xar->wbuff) - xar->wbuff_remaining);
		rs = read(xar->temp_fd, wb, rsize);
		if (rs < 0) {
			archive_set_error(&(a->archive), errno,
			    "Can't read temporary file(%jd)",
			    (intmax_t)rs);
			return (ARCHIVE_FATAL);
		}
		if (rs == 0) {
			archive_set_error(&(a->archive), 0,
			    "Truncated xar archive");
			return (ARCHIVE_FATAL);
		}
		xar->wbuff_remaining -= rs;
		length -= rs;
		if (xar->wbuff_remaining == 0) {
			r = flush_wbuff(a);
			if (r != ARCHIVE_OK)
				return (r);
		}
	}
	return (ARCHIVE_OK);
}